

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O3

bool __thiscall Js::BufferReader::Read<unsigned_short>(BufferReader *this,unsigned_short *data)

{
  ulong uVar1;
  unsigned_short *puVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  uVar1 = this->lengthLeft;
  if (uVar1 < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3bc,"(false)","false");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  else {
    puVar2 = (unsigned_short *)this->current;
    *data = *puVar2;
    this->current = (char *)(puVar2 + 1);
    this->lengthLeft = uVar1 - 2;
  }
  return 1 < uVar1;
}

Assistant:

bool Read(T * data)
        {
            if (lengthLeft < sizeof(T))
            {
                AssertOrFailFast(false);
                return false;
            }
            *data = *(T *)current;
            current += sizeof(T);
            lengthLeft -= sizeof(T);
            return true;
        }